

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O1

void __thiscall
cfd::core::ConfidentialTxIn::ConfidentialTxIn(ConfidentialTxIn *this,ConfidentialTxIn *param_1)

{
  (this->super_AbstractTxIn)._vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_00a93760;
  cfd::core::Txid::Txid(&(this->super_AbstractTxIn).txid_,&(param_1->super_AbstractTxIn).txid_);
  (this->super_AbstractTxIn).vout_ = (param_1->super_AbstractTxIn).vout_;
  cfd::core::Script::Script
            (&(this->super_AbstractTxIn).unlocking_script_,
             &(param_1->super_AbstractTxIn).unlocking_script_);
  (this->super_AbstractTxIn).sequence_ = (param_1->super_AbstractTxIn).sequence_;
  (this->super_AbstractTxIn).script_witness_._vptr_ScriptWitness =
       (_func_int **)&PTR__ScriptWitness_00a93780;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&(this->super_AbstractTxIn).script_witness_.witness_stack_,
             &(param_1->super_AbstractTxIn).script_witness_.witness_stack_);
  (this->super_AbstractTxIn)._vptr_AbstractTxIn = (_func_int **)&PTR__ConfidentialTxIn_00a93718;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->blinding_nonce_).data_,&(param_1->blinding_nonce_).data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->asset_entropy_).data_,&(param_1->asset_entropy_).data_);
  cfd::core::ConfidentialValue::ConfidentialValue
            (&this->issuance_amount_,&param_1->issuance_amount_);
  cfd::core::ConfidentialValue::ConfidentialValue(&this->inflation_keys_,&param_1->inflation_keys_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->issuance_amount_rangeproof_).data_,
             &(param_1->issuance_amount_rangeproof_).data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->inflation_keys_rangeproof_).data_,&(param_1->inflation_keys_rangeproof_).data_)
  ;
  (this->pegin_witness_)._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00a93780;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&(this->pegin_witness_).witness_stack_,&(param_1->pegin_witness_).witness_stack_);
  return;
}

Assistant:

class CFD_CORE_EXPORT ConfidentialTxIn : public AbstractTxIn {
 public:
  /**
   * @brief estimate txin's size, and witness size.
   * @param[in] addr_type           address type
   * @param[in] redeem_script       redeem script
   * @param[in] pegin_btc_tx_size   pegin bitcoin transaction size
   * @param[in] claim_script        claim script
   * @param[in] is_issuance         issuance transaction
   * @param[in] is_blind            blind transaction (for issuance/reissuance)
   * @param[out] witness_area_size     witness area size
   * @param[out] no_witness_area_size  no witness area size
   * @param[in] is_reissuance       reissuance transaction
   * @param[in] scriptsig_template     scriptsig template
   * @param[in] exponent                  rangeproof exponent value.
   *   -1 to 18. -1 is public value. 0 is most private.
   * @param[in] minimum_bits              rangeproof blinding bits.
   *   0 to 64. Number of bits of the value to keep private. 0 is auto.
   * @param[in,out] rangeproof_size       rangeproof size.
   *   0 is calclate from exponent and minimum bits. not 0 is using value.
   * @param[in] pegin_txoutproof_size     pegin txoutproof size.
   * @return TxIn size.
   */
  static uint32_t EstimateTxInSize(
      AddressType addr_type, Script redeem_script = Script(),
      uint32_t pegin_btc_tx_size = 0, Script claim_script = Script(),
      bool is_issuance = false, bool is_blind = false,
      uint32_t* witness_area_size = nullptr,
      uint32_t* no_witness_area_size = nullptr, bool is_reissuance = false,
      const Script* scriptsig_template = nullptr, int exponent = 0,
      int minimum_bits = kDefaultBlindMinimumBits,
      uint32_t* rangeproof_size = nullptr, uint32_t pegin_txoutproof_size = 0);

  /**
   * @brief estimate txin's virtual size direct.
   * @param[in] addr_type           address type
   * @param[in] redeem_script       redeem script
   * @param[in] pegin_btc_tx_size   pegin bitcoin transaction size
   * @param[in] claim_script        claim script
   * @param[in] is_issuance         issuance transaction
   * @param[in] is_blind            blind transaction (for issuance/reissuance)
   * @param[in] is_reissuance       reissuance transaction
   * @param[in] scriptsig_template  scriptsig template
   * @param[in] exponent                  rangeproof exponent value.
   *   -1 to 18. -1 is public value. 0 is most private.
   * @param[in] minimum_bits              rangeproof blinding bits.
   *   0 to 64. Number of bits of the value to keep private. 0 is auto.
   * @param[in,out] rangeproof_size       rangeproof size.
   *   0 is calclate from exponent and minimum bits. not 0 is using value.
   * @param[in] pegin_txoutproof_size     pegin txoutproof size.
   * @return TxIn virtual size.
   */
  static uint32_t EstimateTxInVsize(
      AddressType addr_type, Script redeem_script = Script(),
      uint32_t pegin_btc_tx_size = 0, Script claim_script = Script(),
      bool is_issuance = false, bool is_blind = false,
      bool is_reissuance = false, const Script* scriptsig_template = nullptr,
      int exponent = 0, int minimum_bits = kDefaultBlindMinimumBits,
      uint32_t* rangeproof_size = nullptr, uint32_t pegin_txoutproof_size = 0);

  /**
   * @brief constructor.
   */
  ConfidentialTxIn();
  /**
   * @brief constructor.
   * @param[in] txid        txid
   * @param[in] index       txout's index (vout)
   */
  ConfidentialTxIn(const Txid& txid, uint32_t index);
  /**
   * @brief constructor.
   * @param[in] txid        txid
   * @param[in] index       txout's index (vout)
   * @param[in] sequence    sequence
   */
  ConfidentialTxIn(const Txid& txid, uint32_t index, uint32_t sequence);
  /**
   * @brief constructor.
   * @param[in] txid              txid
   * @param[in] index             txout's index (vout)
   * @param[in] sequence          sequence
   * @param[in] unlocking_script  unlocking script
   */
  ConfidentialTxIn(
      const Txid& txid, uint32_t index, uint32_t sequence,
      const Script& unlocking_script);
  /**
   * @brief constructor.
   * @param[in] txid              txid
   * @param[in] index             txout's index (vout)
   * @param[in] sequence          sequence
   * @param[in] unlocking_script  unlocking script
   * @param[in] witness_stack     witness stack
   * @param[in] blinding_nonce    blinding nonce
   * @param[in] asset_entropy     asset entropy
   * @param[in] issuance_amount   issuance amount
   * @param[in] inflation_keys    inflation keys
   * @param[in] issuance_amount_rangeproof  issuance amount rangeproof
   * @param[in] inflation_keys_rangeproof   inflation keys rangeproof
   * @param[in] pegin_witness     pegin witness
   */
  ConfidentialTxIn(
      const Txid& txid, uint32_t index, uint32_t sequence,
      const Script& unlocking_script, const ScriptWitness& witness_stack,
      const ByteData256& blinding_nonce, const ByteData256& asset_entropy,
      const ConfidentialValue& issuance_amount,
      const ConfidentialValue& inflation_keys,
      const ByteData& issuance_amount_rangeproof,
      const ByteData& inflation_keys_rangeproof,
      const ScriptWitness& pegin_witness);
  /**
   * @brief destructor
   */
  virtual ~ConfidentialTxIn() {
    // do nothing
  }

  /**
   * @brief Update issuance information.
   * @param[in] blinding_nonce    blinding nonce
   * @param[in] asset_entropy     asset entropy
   * @param[in] issuance_amount   issuance amount
   * @param[in] inflation_keys    inflation keys
   * @param[in] issuance_amount_rangeproof  issuance amount rangeproof
   * @param[in] inflation_keys_rangeproof   inflation keys rangeproof
   */
  void SetIssuance(
      const ByteData256& blinding_nonce, const ByteData256& asset_entropy,
      const ConfidentialValue& issuance_amount,
      const ConfidentialValue& inflation_keys,
      const ByteData& issuance_amount_rangeproof,
      const ByteData& inflation_keys_rangeproof);
  /**
   * @brief Get Blinding Nonce
   * @return BlindingNonce
   */
  ByteData256 GetBlindingNonce() const { return blinding_nonce_; }
  /**
   * @brief Get Asset Entropy
   * @return AssetEntropy
   */
  ByteData256 GetAssetEntropy() const { return asset_entropy_; }
  /**
   * @brief Get IssuanceAmount
   * @return IssuanceAmount
   */
  ConfidentialValue GetIssuanceAmount() const { return issuance_amount_; }
  /**
   * @brief Get InflationKeys
   * @return InflationKeys
   */
  ConfidentialValue GetInflationKeys() const { return inflation_keys_; }
  /**
   * @brief Get IssuanceAmountRangeproof
   * @return IssuanceAmountRangeproof
   */
  ByteData GetIssuanceAmountRangeproof() const {
    return issuance_amount_rangeproof_;
  }
  /**
   * @brief Get InflationKeysRangeproof
   * @return InflationKeysRangeproof
   */
  ByteData GetInflationKeysRangeproof() const {
    return inflation_keys_rangeproof_;
  }
  /**
   * @brief Get PeginWitness
   * @return PeginWitness's 'ScriptWitness
   */
  ScriptWitness GetPeginWitness() const { return pegin_witness_; }
  /**
   * @brief Get the current stack count of pegin witness.
   * @return stack count of pegin witness.
   */
  uint32_t GetPeginWitnessStackNum() const {
    return pegin_witness_.GetWitnessNum();
  }

  /**
   * @brief Add byte data to pegin witness.
   * @param[in] data    witness stack data
   * @return Script Witness instance of pegin witness
   */
  ScriptWitness AddPeginWitnessStack(const ByteData& data);
  /**
   * @brief Set byte data to pegin witness.
   * @param[in] index   witness stack index
   * @param[in] data    witness stack data
   * @return Script Witness instance of pegin witness
   */
  ScriptWitness SetPeginWitnessStack(uint32_t index, const ByteData& data);
  /**
   * @brief Remove all pegin witness.
   */
  void RemovePeginWitnessStackAll();

  /**
   * @brief Get the witness hash.
   * @return witness hash
   */
  ByteData256 GetWitnessHash() const;

 private:
  ByteData256 blinding_nonce_;           //!< nonce for blind
  ByteData256 asset_entropy_;            //!< asset entropy
  ConfidentialValue issuance_amount_;    //!< issuance_amount
  ConfidentialValue inflation_keys_;     //!< inflation key
  ByteData issuance_amount_rangeproof_;  //!< amount rangeproof
  ByteData inflation_keys_rangeproof_;   //!< inflation key rangeproof
  ScriptWitness pegin_witness_;          //!< witness stack for pegin
}